

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O3

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteCordOutline
          (EpsCopyOutputStream *this,Cord *c,uint8_t *ptr)

{
  uint uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  
  uVar2 = (ulong)(c->contents_).data_.rep_.field_0.data[0];
  if ((uVar2 & 1) == 0) {
    uVar2 = uVar2 >> 1;
  }
  else {
    uVar2 = ((c->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if ((uint)uVar2 < 0x80) {
    uVar2 = uVar2 & 0xffffffff;
  }
  else {
    uVar4 = uVar2 & 0xffffffff;
    do {
      uVar1 = (uint)uVar2;
      *ptr = (byte)uVar2 | 0x80;
      uVar2 = uVar4 >> 7;
      ptr = ptr + 1;
      uVar4 = uVar2;
    } while (0x3fff < uVar1);
  }
  *ptr = (byte)uVar2;
  puVar3 = WriteCord(this,c,ptr + 1);
  return puVar3;
}

Assistant:

ABSL_CORD_INTERNAL_NO_SANITIZE
    int8_t tag() const { return reinterpret_cast<const int8_t*>(this)[0]; }